

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int cmCTest::GetTestModelFromString(char *str)

{
  bool bVar1;
  uint uVar2;
  allocator<char> local_49;
  string rstr;
  string local_28;
  
  if (str == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,str,&local_49);
    cmsys::SystemTools::LowerCase(&rstr,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,5ul>(&rstr,(char (*) [5])"cont");
    if (bVar1) {
      uVar2 = 2;
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,5ul>(&rstr,(char (*) [5])"nigh");
      uVar2 = (uint)bVar1;
    }
    std::__cxx11::string::~string((string *)&rstr);
  }
  return uVar2;
}

Assistant:

int cmCTest::GetTestModelFromString(const char* str)
{
  if (!str) {
    return cmCTest::EXPERIMENTAL;
  }
  std::string rstr = cmSystemTools::LowerCase(str);
  if (cmHasLiteralPrefix(rstr, "cont")) {
    return cmCTest::CONTINUOUS;
  }
  if (cmHasLiteralPrefix(rstr, "nigh")) {
    return cmCTest::NIGHTLY;
  }
  return cmCTest::EXPERIMENTAL;
}